

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<std::_Rb_tree_const_iterator<Node<Include>>>::
emplace<std::_Rb_tree_const_iterator<Node<Include>>const&>
          (QMovableArrayOps<std::_Rb_tree_const_iterator<Node<Include>_>_> *this,qsizetype i,
          _Rb_tree_const_iterator<Node<Include>_> *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  _Rb_tree_const_iterator<Node<Include>_> *p_Var4;
  Inserter *in_RDX;
  _Rb_tree_const_iterator<Node<Include>_> *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  _Rb_tree_const_iterator<Node<Include>_> tmp;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar6;
  undefined4 in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffae;
  byte bVar7;
  Inserter *this_00;
  Inserter local_38;
  _Base_ptr local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar1 = QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Include>_>_>::needsDetach
                    ((QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Include>_>_> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar3 = QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Include>_>_>::freeSpaceAtEnd
                          ((QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Include>_>_> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT24(in_stack_ffffffffffffffac,
                                                            in_stack_ffffffffffffffa8)))),
       qVar3 != 0)) {
      p_Var4 = QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Include>_>_>::end
                         ((QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Include>_>_> *)in_RDI
                         );
      p_Var4->_M_node = (_Base_ptr)in_RDX->data;
      in_RDI->displaceTo =
           (_Rb_tree_const_iterator<Node<Include>_> *)((long)&in_RDI->displaceTo->_M_node + 1);
      goto LAB_0013e7a8;
    }
    if ((in_RSI == (_Rb_tree_const_iterator<Node<Include>_> *)0x0) &&
       (qVar3 = QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Include>_>_>::freeSpaceAtBegin
                          ((QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Include>_>_> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT24(in_stack_ffffffffffffffac,
                                                            in_stack_ffffffffffffffa8)))),
       qVar3 != 0)) {
      p_Var4 = QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Include>_>_>::begin
                         ((QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Include>_>_> *)
                          0x13e695);
      p_Var4[-1]._M_node = (_Base_ptr)in_RDX->data;
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo =
           (_Rb_tree_const_iterator<Node<Include>_> *)((long)&in_RDI->displaceTo->_M_node + 1);
      goto LAB_0013e7a8;
    }
  }
  local_10 = (_Base_ptr)in_RDX->data;
  bVar5 = in_RDI->displaceTo != (_Rb_tree_const_iterator<Node<Include>_> *)0x0;
  uVar6 = bVar5 && in_RSI == (_Rb_tree_const_iterator<Node<Include>_> *)0x0;
  uVar2 = (uint)(bVar5 && in_RSI == (_Rb_tree_const_iterator<Node<Include>_> *)0x0);
  bVar7 = uVar6;
  QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Include>_>_>::detachAndGrow
            ((QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Include>_>_> *)this_00,
             (GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
             (_Rb_tree_const_iterator<Node<Include>_> **)
             CONCAT17(uVar1,CONCAT16(uVar6,CONCAT24(in_stack_ffffffffffffffac,uVar2))),
             (QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Include>_>_> *)in_RDI);
  if ((bVar7 & 1) == 0) {
    QMovableArrayOps<std::_Rb_tree_const_iterator<Node<Include>_>_>::Inserter::Inserter
              (in_RDX,(QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Include>_>_> *)
                      CONCAT17(uVar1,CONCAT16(bVar7,CONCAT24(in_stack_ffffffffffffffac,uVar2))),
               (qsizetype)in_RDI,CONCAT17(uVar6,in_stack_ffffffffffffff98));
    QMovableArrayOps<std::_Rb_tree_const_iterator<Node<Include>_>_>::Inserter::insertOne
              (in_RDI,(_Rb_tree_const_iterator<Node<Include>_> *)
                      CONCAT17(uVar6,in_stack_ffffffffffffff98));
    QMovableArrayOps<std::_Rb_tree_const_iterator<Node<Include>_>_>::Inserter::~Inserter(&local_38);
  }
  else {
    p_Var4 = QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Include>_>_>::begin
                       ((QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Include>_>_> *)0x13e74b
                       );
    p_Var4[-1]._M_node = local_10;
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo =
         (_Rb_tree_const_iterator<Node<Include>_> *)((long)&in_RDI->displaceTo->_M_node + 1);
  }
LAB_0013e7a8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }